

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * doctest::detail::StringMakerBase<true>::convert<char[22]>
                   (String *__return_storage_ptr__,char (*in) [22])

{
  ostream *poVar1;
  
  poVar1 = tlssPush();
  std::operator<<(poVar1,*in);
  tlssPop();
  return __return_storage_ptr__;
}

Assistant:

static String convert(const DOCTEST_REF_WRAP(T) in) {
                /* When parameter "in" is a null terminated const char* it works.
                 * When parameter "in" is a T arr[N] without '\0' we can fill the
                 * stringstream with N objects (T=char).If in is char pointer *
                 * without '\0' , it would cause segfault
                 * stepping over unaccessible memory.
                 */

                std::ostream* stream = tlssPush();
                filloss(stream, in);
                return tlssPop();
            }